

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

float stbtt__oversample_shift(int oversample)

{
  undefined4 local_c;
  int oversample_local;
  
  if (oversample == 0) {
    local_c = 0.0;
  }
  else {
    local_c = (float)-(oversample + -1) / ((float)oversample * 2.0);
  }
  return local_c;
}

Assistant:

static float stbtt__oversample_shift(int oversample)
{
   if (!oversample)
      return 0.0f;

   // The prefilter is a box filter of width "oversample",
   // which shifts phase by (oversample - 1)/2 pixels in
   // oversampled space. We want to shift in the opposite
   // direction to counter this.
   return (float)-(oversample - 1) / (2.0f * (float)oversample);
}